

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int upvalue(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = 2;
  lVar2 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,6);
  iVar1 = lua_type(L,3);
  if (iVar1 == -1) {
    pcVar3 = lua_getupvalue(L,1,(int)lVar2);
    if (pcVar3 == (char *)0x0) {
      iVar4 = 0;
    }
    else {
      lua_pushstring(L,pcVar3);
    }
  }
  else {
    pcVar3 = lua_setupvalue(L,1,(int)lVar2);
    lua_pushstring(L,pcVar3);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int upvalue (lua_State *L) {
  int n = cast_int(luaL_checkinteger(L, 2));
  luaL_checktype(L, 1, LUA_TFUNCTION);
  if (lua_isnone(L, 3)) {
    const char *name = lua_getupvalue(L, 1, n);
    if (name == NULL) return 0;
    lua_pushstring(L, name);
    return 2;
  }
  else {
    const char *name = lua_setupvalue(L, 1, n);
    lua_pushstring(L, name);
    return 1;
  }
}